

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

char * ptls_hexdump(char *dst,void *_src,size_t len)

{
  byte bVar1;
  size_t i;
  size_t sVar2;
  char *buf;
  
  for (sVar2 = 0; len != sVar2; sVar2 = sVar2 + 1) {
    bVar1 = *(byte *)((long)_src + sVar2);
    dst[sVar2 * 2] = "0123456789abcdef0123456789abcdef0123456789abcdef"[(ulong)(bVar1 >> 4) + 0x20];
    dst[sVar2 * 2 + 1] =
         "0123456789abcdef0123456789abcdef0123456789abcdef"[(ulong)(bVar1 & 0xf) + 0x20];
  }
  dst[sVar2 * 2] = '\0';
  return dst;
}

Assistant:

char *ptls_hexdump(char *dst, const void *_src, size_t len)
{
    char *buf = dst;
    const uint8_t *src = _src;

    for (size_t i = 0; i != len; ++i)
        dst = byte_to_hex(dst, src[i]);
    *dst = '\0';
    return buf;
}